

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O3

int vrna_E_ext_loop_5(vrna_fold_compound_t *fc)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  vrna_hc_t *pvVar5;
  int *piVar6;
  vrna_param_t *pvVar7;
  vrna_gr_aux_t *pvVar8;
  vrna_sc_t *pvVar9;
  vrna_sc_t **ppvVar10;
  int *piVar11;
  short *psVar12;
  char *pcVar13;
  short **ppsVar14;
  uint **ppuVar15;
  uint *puVar16;
  bool bVar17;
  undefined1 *puVar18;
  undefined1 *puVar19;
  uchar uVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  code *pcVar25;
  void *pvVar26;
  void *pvVar27;
  void *pvVar28;
  ulong uVar29;
  int *piVar30;
  ulong uVar31;
  short sVar32;
  uint uVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  code *evaluate;
  long lVar38;
  int *piVar39;
  int iVar40;
  int (*paaiVar41) [5] [5];
  int (*paiVar42) [5];
  uint uVar43;
  long lVar44;
  ulong uVar45;
  ulong uVar46;
  uint uVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  ulong uVar53;
  uint uVar54;
  uint uVar55;
  long lVar56;
  bool bVar57;
  sc_wrapper_f5 sc_wrapper;
  default_data hc_dat_local;
  ulong local_1a0;
  long local_140;
  sc_wrapper_f5 local_e0;
  long local_80;
  int local_74;
  default_data local_70;
  int (*local_38) [5] [5];
  
  if (fc == (vrna_fold_compound_t *)0x0) {
    return 10000000;
  }
  uVar3 = fc->length;
  pvVar5 = fc->hc;
  piVar6 = (fc->matrices->field_2).field_0.f5;
  pvVar7 = fc->params;
  iVar22 = (pvVar7->model_details).dangles;
  iVar4 = (pvVar7->model_details).gquad;
  uVar55 = (pvVar7->model_details).min_loop_size;
  local_1a0 = (ulong)uVar55;
  pvVar8 = fc->aux_grammar;
  local_70.mx = (pvVar5->field_3).field_0.mx;
  local_70.hc_up = pvVar5->up_ext;
  local_70.sn = fc->strand_number;
  if (pvVar5->f == (vrna_callback_hc_evaluate *)0x0) {
    uVar33 = fc->strands;
    pcVar25 = hc_default;
    evaluate = hc_default_sn;
  }
  else {
    local_70.hc_dat = pvVar5->data;
    uVar33 = fc->strands;
    pcVar25 = hc_default_user;
    evaluate = hc_default_sn_user;
    local_70.hc_f = pvVar5->f;
  }
  if (uVar33 == 1) {
    evaluate = pcVar25;
  }
  local_e0.up = (int **)0x0;
  local_e0.user_cb = (vrna_callback_sc_energy *)0x0;
  local_e0.user_data = (void *)0x0;
  local_e0.n_seq = 1;
  local_e0.red_ext = (code *)0x0;
  local_e0.red_stem = (code *)0x0;
  local_e0.decomp_stem = (code *)0x0;
  local_e0.decomp_stem1 = (code *)0x0;
  local_e0.up_comparative = (int ***)0x0;
  local_e0.user_cb_comparative = (vrna_callback_sc_energy **)0x0;
  local_e0.user_data_comparative = (void **)0x0;
  local_70.n = uVar3;
  if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
    ppvVar10 = (fc->field_23).field_1.scs;
    local_e0.n_seq = (fc->field_23).field_1.n_seq;
    local_e0.a2s = (fc->field_23).field_1.a2s;
    if (ppvVar10 == (vrna_sc_t **)0x0) goto LAB_00119a76;
    local_e0.up_comparative = (int ***)vrna_alloc(local_e0.n_seq << 3);
    local_e0.user_cb_comparative =
         (vrna_callback_sc_energy **)vrna_alloc((fc->field_23).field_1.n_seq << 3);
    local_e0.user_data_comparative = (void **)vrna_alloc((fc->field_23).field_1.n_seq << 3);
    uVar33 = (fc->field_23).field_1.n_seq;
    if (uVar33 == 0) goto LAB_00119a76;
    uVar45 = 0;
    bVar57 = false;
    bVar17 = false;
    do {
      if (ppvVar10[uVar45] != (vrna_sc_t *)0x0) {
        local_e0.up_comparative[uVar45] = ppvVar10[uVar45]->energy_up;
        local_e0.user_cb_comparative[uVar45] = ppvVar10[uVar45]->f;
        local_e0.user_data_comparative[uVar45] = ppvVar10[uVar45]->data;
        if (ppvVar10[uVar45]->energy_up != (int **)0x0) {
          bVar17 = true;
        }
        if (ppvVar10[uVar45]->f != (vrna_callback_sc_energy *)0x0) {
          bVar57 = true;
        }
        uVar33 = (fc->field_23).field_1.n_seq;
      }
      uVar45 = uVar45 + 1;
    } while (uVar45 < uVar33);
    if (!bVar17) {
      if (bVar57) {
        local_e0.decomp_stem1 = sc_user_f5_split_in_ext_stem1_comparative;
        local_e0.decomp_stem = sc_user_f5_split_in_ext_stem_comparative;
        local_e0.red_stem = sc_user_f5_reduce_to_stem_comparative;
        local_e0.red_ext = sc_user_f5_reduce_to_ext_comparative;
      }
      goto LAB_00119a76;
    }
    bVar57 = !bVar57;
    local_e0.red_ext = sc_user_def_f5_reduce_to_ext_comparative;
    if (bVar57) {
      local_e0.red_ext = sc_default_f5_reduce_comparative;
    }
    local_e0.red_stem = sc_user_def_f5_reduce_to_stem_comparative;
    if (bVar57) {
      local_e0.red_stem = sc_default_f5_reduce_comparative;
    }
    local_e0.decomp_stem = sc_user_def_f5_split_in_ext_stem_comparative;
    if (bVar57) {
      local_e0.decomp_stem = sc_default_f5_split_in_ext_stem_comparative;
    }
    pcVar25 = sc_default_f5_split_in_ext_stem1_comparative;
    local_e0.decomp_stem1 = sc_user_def_f5_split_in_ext_stem1_comparative;
  }
  else {
    if ((fc->type != VRNA_FC_TYPE_SINGLE) ||
       (pvVar9 = (fc->field_23).field_0.sc, pvVar9 == (vrna_sc_t *)0x0)) goto LAB_00119a76;
    local_e0.up = pvVar9->energy_up;
    local_e0.user_cb = pvVar9->f;
    local_e0.user_data = pvVar9->data;
    if (local_e0.up == (int **)0x0) {
      if (local_e0.user_cb != (vrna_callback_sc_energy *)0x0) {
        local_e0.decomp_stem1 = sc_user_f5_split_in_ext_stem1;
        local_e0.decomp_stem = sc_user_f5_split_in_ext_stem;
        local_e0.red_stem = sc_user_f5_reduce_to_stem;
        local_e0.red_ext = sc_user_f5_reduce_to_ext;
      }
      goto LAB_00119a76;
    }
    bVar57 = local_e0.user_cb == (vrna_callback_sc_energy *)0x0;
    local_e0.red_ext = sc_user_def_f5_reduce_to_ext;
    if (bVar57) {
      local_e0.red_ext = sc_default_f5_reduce;
    }
    local_e0.red_stem = sc_user_def_f5_reduce_to_stem;
    if (bVar57) {
      local_e0.red_stem = sc_default_f5_reduce;
    }
    local_e0.decomp_stem = sc_user_def_f5_split_in_ext_stem;
    if (bVar57) {
      local_e0.decomp_stem = sc_default_f5_split_in_ext_stem;
    }
    pcVar25 = sc_default_f5_split_in_ext_stem1;
    local_e0.decomp_stem1 = sc_user_def_f5_split_in_ext_stem1;
  }
  if (bVar57) {
    local_e0.decomp_stem1 = pcVar25;
  }
LAB_00119a76:
  *piVar6 = 0;
  if (-1 < (int)uVar55) {
    lVar44 = 1;
    do {
      iVar21 = reduce_f5_up(fc,(int)lVar44,evaluate,&local_70,&local_e0);
      piVar6[lVar44] = iVar21;
      lVar44 = lVar44 + 1;
    } while (local_1a0 + 2 != lVar44);
  }
  if ((pvVar8 != (vrna_gr_aux_t *)0x0) &&
     (pvVar8->cb_aux_f != (vrna_callback_gr_rule *)0x0 && -1 < (int)uVar55)) {
    lVar44 = 1;
    do {
      iVar21 = (*pvVar8->cb_aux_f)(fc,1,(int)lVar44,pvVar8->data);
      if (piVar6[lVar44] < iVar21) {
        iVar21 = piVar6[lVar44];
      }
      piVar6[lVar44] = iVar21;
      lVar44 = lVar44 + 1;
    } while (local_1a0 + 2 != lVar44);
  }
  iVar21 = uVar55 + 2;
  if (iVar22 == 0) {
    if (iVar21 <= (int)uVar3) {
      lVar44 = (long)iVar21;
      do {
        uVar55 = uVar55 + 1;
        iVar24 = (int)lVar44;
        iVar22 = reduce_f5_up(fc,iVar24,evaluate,&local_70,&local_e0);
        piVar6[lVar44] = iVar22;
        piVar30 = get_stem_contributions_d0(fc,iVar24,evaluate,&local_70,&local_e0);
        iVar21 = vrna_fun_zip_add_min
                           ((fc->matrices->field_2).field_0.f5 + 1,piVar30 + 2,
                            (iVar24 - (fc->params->model_details).min_loop_size) + -2);
        iVar22 = piVar30[1];
        if (iVar21 < piVar30[1]) {
          iVar22 = iVar21;
        }
        free(piVar30);
        if (piVar6[lVar44] < iVar22) {
          iVar22 = piVar6[lVar44];
        }
        piVar6[lVar44] = iVar22;
        if (iVar4 != 0) {
          piVar30 = (fc->matrices->field_2).field_0.ggg;
          uVar33 = (fc->params->model_details).min_loop_size;
          iVar21 = 10000000;
          if (1 < (int)(~uVar33 + iVar24)) {
            iVar50 = iVar24 - uVar33;
            iVar21 = 10000000;
            lVar56 = 0;
            do {
              iVar34 = *(int *)((long)(fc->matrices->field_2).field_0.f5 +
                               lVar56 + (ulong)(uVar55 - uVar33) * 4 + -4);
              if (((iVar34 != 10000000) &&
                  (iVar51 = *(int *)((long)piVar30 +
                                    lVar56 + (long)(int)((fc->jindx[lVar44] + uVar55) - uVar33) * 4)
                  , iVar51 != 10000000)) && (iVar51 = iVar51 + iVar34, iVar51 <= iVar21)) {
                iVar21 = iVar51;
              }
              lVar56 = lVar56 + -4;
              iVar50 = iVar50 + -1;
            } while (2 < iVar50);
          }
          iVar50 = piVar30[(long)fc->jindx[lVar44] + 1];
          if (iVar21 < iVar50) {
            iVar50 = iVar21;
          }
          if (iVar22 < iVar50) {
            iVar50 = iVar22;
          }
          piVar6[lVar44] = iVar50;
        }
        if ((pvVar8 != (vrna_gr_aux_t *)0x0) && (pvVar8->cb_aux_f != (vrna_callback_gr_rule *)0x0))
        {
          iVar22 = (*pvVar8->cb_aux_f)(fc,1,iVar24,pvVar8->data);
          if (piVar6[lVar44] < iVar22) {
            iVar22 = piVar6[lVar44];
          }
          piVar6[lVar44] = iVar22;
        }
        lVar44 = lVar44 + 1;
      } while (uVar3 + 1 != (int)lVar44);
    }
  }
  else if (iVar22 == 2) {
    if (iVar21 <= (int)uVar3) {
      uVar45 = (ulong)iVar21;
      local_140 = uVar45 * 2 + -4;
      do {
        uVar55 = uVar55 + 1;
        iVar21 = (int)uVar45;
        iVar22 = reduce_f5_up(fc,iVar21,evaluate,&local_70,&local_e0);
        piVar6[uVar45] = iVar22;
        pvVar26 = vrna_alloc(iVar21 * 4);
        puVar19 = local_e0.decomp_stem;
        puVar18 = local_e0.red_stem;
        uVar33 = fc->length;
        pvVar7 = fc->params;
        piVar30 = fc->jindx;
        piVar11 = (fc->matrices->field_2).field_0.c;
        uVar47 = (pvVar7->model_details).min_loop_size;
        iVar22 = piVar30[uVar45];
        uVar54 = ~uVar47 + iVar21;
        uVar46 = (ulong)uVar54;
        iVar24 = (int)local_1a0;
        if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
          uVar23 = (fc->field_23).field_1.n_seq;
          uVar31 = (ulong)uVar23;
          pcVar13 = (fc->field_23).field_0.ptype_pf_compat;
          pvVar9 = (fc->field_23).field_0.sc;
          ppsVar14 = (fc->field_23).field_1.S3;
          ppuVar15 = (fc->field_23).field_1.a2s;
          uVar23 = uVar23 * 2;
          pvVar27 = vrna_alloc(uVar23);
          pvVar28 = vrna_alloc(uVar23);
          if (uVar31 != 0) {
            uVar29 = 0;
            do {
              puVar16 = ppuVar15[uVar29];
              sVar32 = -1;
              if (puVar16[uVar45] < puVar16[(int)uVar33]) {
                sVar32 = ppsVar14[uVar29][uVar45];
              }
              *(short *)((long)pvVar27 + uVar29 * 2) = sVar32;
              *(undefined2 *)((long)pvVar28 + uVar29 * 2) =
                   *(undefined2 *)(*(long *)(pcVar13 + uVar29 * 8) + uVar45 * 2);
              uVar29 = uVar29 + 1;
            } while (uVar31 != uVar29);
          }
          if (1 < (int)uVar54) {
            lVar44 = (long)(int)(iVar22 + uVar54);
            uVar29 = uVar46;
            do {
              *(undefined4 *)((long)pvVar26 + uVar29 * 4) = 10000000;
              iVar22 = (int)uVar29;
              if (((piVar11[lVar44] != 10000000) &&
                  (uVar20 = (*evaluate)(1,iVar21,iVar22 + -1,iVar22,'\x12',&local_70),
                  uVar20 != '\0')) &&
                 (*(int *)((long)pvVar26 + uVar29 * 4) = piVar11[lVar44], uVar31 != 0)) {
                uVar53 = 0;
                do {
                  uVar33 = vrna_get_ptype_md((int)*(short *)(*(long *)(pcVar13 + uVar53 * 8) +
                                                            uVar29 * 2),
                                             (int)*(short *)((long)pvVar28 + uVar53 * 2),
                                             &pvVar7->model_details);
                  if (ppuVar15[uVar53][uVar29] < 2) {
                    uVar2 = *(ushort *)((long)pvVar27 + uVar53 * 2);
                    uVar54 = (uint)(short)uVar2;
joined_r0x00119fd4:
                    paaiVar41 = (int (*) [5] [5])pvVar7->dangle3;
                    uVar23 = uVar33;
                    if (-1 < (short)uVar2) {
LAB_00119fe3:
                      piVar39 = (*paaiVar41)[uVar23] + uVar54;
                      goto LAB_00119feb;
                    }
                    iVar50 = 0;
                  }
                  else {
                    uVar1 = *(ushort *)(*(long *)(&pvVar9->type + uVar53 * 2) + uVar29 * 2);
                    uVar2 = *(ushort *)((long)pvVar27 + uVar53 * 2);
                    uVar54 = (uint)(short)uVar2;
                    if (-1 < (short)(uVar2 | uVar1)) {
                      paaiVar41 = pvVar7->mismatchExt + uVar33;
                      uVar23 = (int)(short)uVar1;
                      goto LAB_00119fe3;
                    }
                    if ((short)uVar1 < 0) goto joined_r0x00119fd4;
                    piVar39 = pvVar7->dangle5[uVar33] + (uint)(int)(short)uVar1;
LAB_00119feb:
                    iVar50 = *piVar39;
                  }
                  if (2 < uVar33) {
                    iVar50 = iVar50 + pvVar7->TerminalAU;
                  }
                  piVar39 = (int *)((long)pvVar26 + uVar29 * 4);
                  *piVar39 = *piVar39 + iVar50;
                  uVar53 = uVar53 + 1;
                } while (uVar31 != uVar53);
              }
              uVar29 = uVar29 - 1;
              lVar44 = lVar44 + -1;
            } while (2 < iVar22);
            if ((code *)puVar19 != (code *)0x0) {
              iVar50 = iVar21 - uVar47;
              iVar22 = iVar24 - uVar47;
              do {
                if (*(int *)((long)pvVar26 + uVar46 * 4) != 10000000) {
                  iVar34 = (*(code *)puVar19)(uVar45,iVar22,uVar46 & 0xffffffff,&local_e0);
                  piVar39 = (int *)((long)pvVar26 + uVar46 * 4);
                  *piVar39 = *piVar39 + iVar34;
                }
                uVar46 = uVar46 - 1;
                iVar50 = iVar50 + -1;
                iVar22 = iVar22 + -1;
              } while (2 < iVar50);
            }
          }
          *(undefined4 *)((long)pvVar26 + 4) = 10000000;
          iVar22 = piVar30[uVar45];
          if ((piVar11[(long)iVar22 + 1] != 10000000) &&
             (uVar20 = (*evaluate)(1,iVar21,1,iVar21,'\x0e',&local_70), uVar20 != '\0')) {
            *(int *)((long)pvVar26 + 4) = piVar11[(long)iVar22 + 1];
            if (uVar31 != 0) {
              uVar46 = 0;
              do {
                uVar33 = vrna_get_ptype_md((int)*(short *)(*(long *)(pcVar13 + uVar46 * 8) + 2),
                                           (int)*(short *)((long)pvVar28 + uVar46 * 2),
                                           &pvVar7->model_details);
                lVar44 = (long)*(short *)((long)pvVar27 + uVar46 * 2);
                if (lVar44 < 0) {
                  iVar22 = 0;
                }
                else {
                  iVar22 = pvVar7->dangle3[uVar33][lVar44];
                }
                if (2 < uVar33) {
                  iVar22 = iVar22 + pvVar7->TerminalAU;
                }
                *(int *)((long)pvVar26 + 4) = *(int *)((long)pvVar26 + 4) + iVar22;
                uVar46 = uVar46 + 1;
              } while (uVar31 != uVar46);
            }
            if ((code *)puVar18 != (code *)0x0) {
              iVar22 = (*(code *)puVar18)(uVar45,1,uVar45 & 0xffffffff,&local_e0);
              *(int *)((long)pvVar26 + 4) = *(int *)((long)pvVar26 + 4) + iVar22;
            }
          }
          free(pvVar27);
          free(pvVar28);
        }
        else if (fc->type == VRNA_FC_TYPE_SINGLE) {
          psVar12 = (fc->field_23).field_0.sequence_encoding;
          uVar23 = 0xffffffff;
          if ((long)uVar45 < (long)(int)uVar33) {
            uVar23 = (uint)psVar12[uVar45 + 1];
          }
          pcVar13 = (fc->field_23).field_0.ptype;
          if (1 < (int)uVar54) {
            iVar22 = (iVar22 + uVar55) - uVar47;
            iVar50 = iVar21 - uVar47;
            lVar44 = 0;
            do {
              *(undefined4 *)((long)pvVar26 + lVar44 * 4 + (ulong)(uVar55 - uVar47) * 4) = 10000000;
              if (piVar11[iVar22 + lVar44] != 10000000) {
                iVar34 = (int)lVar44;
                uVar20 = (*evaluate)(1,iVar21,(iVar24 - uVar47) + iVar34,
                                     (iVar24 - uVar47) + iVar34 + 1,'\x12',&local_70);
                if (uVar20 != '\0') {
                  uVar54 = vrna_get_ptype(iVar22 + iVar34,pcVar13);
                  sVar32 = *(short *)((long)psVar12 +
                                     lVar44 * 2 + local_140 + (long)(int)uVar47 * -2);
                  uVar33 = (uint)sVar32;
                  if ((int)(uVar23 | uVar33) < 0) {
                    if (-1 < sVar32) {
                      piVar39 = pvVar7->dangle5[uVar54] + uVar33;
                      goto LAB_00119db8;
                    }
                    paaiVar41 = (int (*) [5] [5])pvVar7->dangle3;
                    uVar33 = uVar54;
                    if (-1 < (int)uVar23) goto LAB_00119d8f;
                    iVar34 = 0;
                  }
                  else {
                    paaiVar41 = pvVar7->mismatchExt + uVar54;
LAB_00119d8f:
                    piVar39 = (*paaiVar41)[uVar33] + uVar23;
LAB_00119db8:
                    iVar34 = *piVar39;
                  }
                  if (2 < uVar54) {
                    iVar34 = iVar34 + pvVar7->TerminalAU;
                  }
                  *(int *)((long)pvVar26 + lVar44 * 4 + (ulong)(uVar55 - uVar47) * 4) =
                       iVar34 + piVar11[iVar22 + lVar44];
                }
              }
              lVar44 = lVar44 + -1;
              iVar50 = iVar50 + -1;
            } while (2 < iVar50);
            if ((code *)puVar19 != (code *)0x0) {
              iVar22 = iVar21 - uVar47;
              iVar50 = iVar24 - uVar47;
              do {
                if (*(int *)((long)pvVar26 + uVar46 * 4) != 10000000) {
                  iVar34 = (*(code *)puVar19)(uVar45,iVar50,uVar46 & 0xffffffff,&local_e0);
                  piVar39 = (int *)((long)pvVar26 + uVar46 * 4);
                  *piVar39 = *piVar39 + iVar34;
                }
                uVar46 = uVar46 - 1;
                iVar22 = iVar22 + -1;
                iVar50 = iVar50 + -1;
              } while (2 < iVar22);
            }
          }
          *(undefined4 *)((long)pvVar26 + 4) = 10000000;
          iVar22 = piVar30[uVar45];
          if ((piVar11[(long)iVar22 + 1] != 10000000) &&
             (uVar20 = (*evaluate)(1,iVar21,1,iVar21,'\x0e',&local_70), uVar20 != '\0')) {
            uVar33 = vrna_get_ptype(iVar22 + 1,pcVar13);
            if ((int)uVar23 < 0) {
              iVar50 = 0;
            }
            else {
              iVar50 = pvVar7->dangle3[uVar33][uVar23];
            }
            if (2 < uVar33) {
              iVar50 = iVar50 + pvVar7->TerminalAU;
            }
            *(int *)((long)pvVar26 + 4) = iVar50 + piVar11[(long)iVar22 + 1];
            if ((code *)puVar18 != (code *)0x0) {
              iVar22 = (*(code *)puVar18)(uVar45,1,uVar45 & 0xffffffff,&local_e0);
              *(int *)((long)pvVar26 + 4) = *(int *)((long)pvVar26 + 4) + iVar22;
            }
          }
        }
        iVar50 = vrna_fun_zip_add_min
                           ((fc->matrices->field_2).field_0.f5 + 1,(int *)((long)pvVar26 + 8),
                            (iVar21 - (fc->params->model_details).min_loop_size) + -2);
        iVar22 = *(int *)((long)pvVar26 + 4);
        if (iVar50 < *(int *)((long)pvVar26 + 4)) {
          iVar22 = iVar50;
        }
        free(pvVar26);
        if (piVar6[uVar45] < iVar22) {
          iVar22 = piVar6[uVar45];
        }
        piVar6[uVar45] = iVar22;
        if (iVar4 != 0) {
          piVar30 = (fc->matrices->field_2).field_0.ggg;
          uVar33 = (fc->params->model_details).min_loop_size;
          iVar50 = 10000000;
          if (1 < (int)(~uVar33 + iVar21)) {
            iVar34 = iVar21 - uVar33;
            iVar50 = 10000000;
            lVar44 = 0;
            do {
              iVar51 = *(int *)((long)(fc->matrices->field_2).field_0.f5 +
                               lVar44 + (ulong)(uVar55 - uVar33) * 4 + -4);
              if (((iVar51 != 10000000) &&
                  (iVar48 = *(int *)((long)piVar30 +
                                    lVar44 + (long)(int)((fc->jindx[uVar45] + uVar55) - uVar33) * 4)
                  , iVar48 != 10000000)) && (iVar48 = iVar48 + iVar51, iVar48 <= iVar50)) {
                iVar50 = iVar48;
              }
              lVar44 = lVar44 + -4;
              iVar34 = iVar34 + -1;
            } while (2 < iVar34);
          }
          iVar34 = piVar30[(long)fc->jindx[uVar45] + 1];
          if (iVar50 < iVar34) {
            iVar34 = iVar50;
          }
          if (iVar22 < iVar34) {
            iVar34 = iVar22;
          }
          piVar6[uVar45] = iVar34;
        }
        if ((pvVar8 != (vrna_gr_aux_t *)0x0) && (pvVar8->cb_aux_f != (vrna_callback_gr_rule *)0x0))
        {
          iVar22 = (*pvVar8->cb_aux_f)(fc,1,iVar21,pvVar8->data);
          if (piVar6[uVar45] < iVar22) {
            iVar22 = piVar6[uVar45];
          }
          piVar6[uVar45] = iVar22;
        }
        uVar45 = uVar45 + 1;
        local_1a0 = (ulong)(iVar24 + 1);
        local_140 = local_140 + 2;
      } while (uVar3 + 1 != (int)uVar45);
    }
  }
  else if (iVar21 <= (int)uVar3) {
    uVar45 = (ulong)iVar21;
    local_74 = uVar3 + 1;
    local_80 = uVar45 * 2 + -2;
    do {
      uVar55 = uVar55 + 1;
      iVar50 = (int)uVar45;
      iVar22 = reduce_f5_up(fc,iVar50,evaluate,&local_70,&local_e0);
      piVar6[uVar45] = iVar22;
      piVar30 = get_stem_contributions_d0(fc,iVar50,evaluate,&local_70,&local_e0);
      iVar51 = iVar50 + -2;
      iVar24 = vrna_fun_zip_add_min
                         ((fc->matrices->field_2).field_0.f5 + 1,piVar30 + 2,
                          iVar51 - (fc->params->model_details).min_loop_size);
      iVar22 = piVar30[1];
      free(piVar30);
      uVar47 = iVar50 * 4;
      pvVar26 = vrna_alloc(uVar47);
      puVar19 = local_e0.decomp_stem;
      puVar18 = local_e0.red_stem;
      pvVar7 = fc->params;
      piVar30 = fc->jindx;
      piVar11 = (fc->matrices->field_2).field_0.c;
      uVar33 = (pvVar7->model_details).min_loop_size;
      iVar21 = piVar30[uVar45];
      iVar34 = (int)local_1a0;
      if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
        uVar54 = (fc->field_23).field_1.n_seq;
        uVar46 = (ulong)uVar54;
        pcVar13 = (fc->field_23).field_0.ptype_pf_compat;
        pvVar9 = (fc->field_23).field_0.sc;
        ppuVar15 = (fc->field_23).field_1.a2s;
        pvVar27 = vrna_alloc(uVar54 * 2);
        if (uVar46 != 0) {
          uVar31 = 0;
          do {
            *(undefined2 *)((long)pvVar27 + uVar31 * 2) =
                 *(undefined2 *)(*(long *)(pcVar13 + uVar31 * 8) + uVar45 * 2);
            uVar31 = uVar31 + 1;
          } while (uVar46 != uVar31);
        }
        uVar54 = ~uVar33 + iVar50;
        if (1 < (int)uVar54) {
          uVar31 = (ulong)uVar54;
          lVar44 = (long)(int)((iVar50 - uVar33) + iVar21);
          do {
            *(undefined4 *)((long)pvVar26 + uVar31 * 4) = 10000000;
            iVar21 = (int)uVar31;
            if (((piVar11[lVar44] != 10000000) &&
                (uVar20 = (*evaluate)(1,iVar50,iVar21 + -1,iVar21 + 1,'\x12',&local_70),
                uVar20 != '\0')) &&
               (*(int *)((long)pvVar26 + uVar31 * 4) = piVar11[lVar44], uVar46 != 0)) {
              uVar29 = 0;
              do {
                uVar54 = vrna_get_ptype_md((int)*(short *)(*(long *)(pcVar13 + uVar29 * 8) + 2 +
                                                          uVar31 * 2),
                                           (int)*(short *)((long)pvVar27 + uVar29 * 2),
                                           &pvVar7->model_details);
                iVar48 = 0;
                if ((1 < ppuVar15[uVar29][uVar31 + 1]) &&
                   (lVar56 = (long)*(short *)(*(long *)(&pvVar9->type + uVar29 * 2) + 2 + uVar31 * 2
                                             ), iVar48 = 0, -1 < lVar56)) {
                  iVar48 = pvVar7->dangle5[uVar54][lVar56];
                }
                if (2 < uVar54) {
                  iVar48 = iVar48 + pvVar7->TerminalAU;
                }
                *(int *)((long)pvVar26 + uVar31 * 4) = iVar48;
                uVar29 = uVar29 + 1;
              } while (uVar46 != uVar29);
            }
            uVar31 = uVar31 - 1;
            lVar44 = lVar44 + -1;
          } while (2 < iVar21);
          if ((code *)puVar19 != (code *)0x0) {
            iVar21 = iVar50 - uVar33;
            iVar48 = iVar34 - uVar33;
            piVar39 = (int *)((long)pvVar26 + (ulong)(uVar55 - uVar33) * 4);
            do {
              if (*piVar39 != 10000000) {
                iVar35 = (*(code *)puVar19)(uVar45,iVar48,iVar21,&local_e0);
                *piVar39 = *piVar39 + iVar35;
              }
              iVar21 = iVar21 + -1;
              iVar48 = iVar48 + -1;
              piVar39 = piVar39 + -1;
            } while (2 < iVar21);
          }
          uVar54 = 1;
        }
        *(undefined4 *)((long)pvVar26 + 4) = 10000000;
        iVar21 = piVar30[uVar45];
        if ((piVar11[(long)iVar21 + 2] != 10000000) &&
           (uVar20 = (*evaluate)(1,iVar50,2,iVar50,'\x0e',&local_70), uVar20 != '\0')) {
          *(int *)((long)pvVar26 + 4) = piVar11[(long)iVar21 + 2];
          if (uVar46 != 0) {
            uVar31 = 0;
            do {
              uVar33 = vrna_get_ptype_md((int)*(short *)(*(long *)(pcVar13 + uVar31 * 8) + 4),
                                         (int)*(short *)((long)pvVar27 + uVar31 * 2),
                                         &pvVar7->model_details);
              iVar21 = 0;
              if ((1 < ppuVar15[uVar31][2]) &&
                 (lVar44 = (long)*(short *)(*(long *)(&pvVar9->type + uVar31 * 2) + 4), iVar21 = 0,
                 -1 < lVar44)) {
                iVar21 = pvVar7->dangle5[uVar33][lVar44];
              }
              if (2 < uVar33) {
                iVar21 = iVar21 + pvVar7->TerminalAU;
              }
              *(int *)((long)pvVar26 + (long)(int)uVar54 * 4) = iVar21;
              uVar31 = uVar31 + 1;
            } while (uVar46 != uVar31);
          }
          if ((code *)puVar18 != (code *)0x0) {
            iVar21 = (*(code *)puVar18)(uVar45,2,uVar45 & 0xffffffff,&local_e0);
            *(int *)((long)pvVar26 + 4) = *(int *)((long)pvVar26 + 4) + iVar21;
          }
        }
        free(pvVar27);
      }
      else if (fc->type == VRNA_FC_TYPE_SINGLE) {
        psVar12 = (fc->field_23).field_0.sequence_encoding;
        pcVar13 = (fc->field_23).field_0.ptype;
        if (1 < (int)(~uVar33 + iVar50)) {
          iVar48 = (iVar21 + iVar50) - uVar33;
          iVar21 = iVar50 - uVar33;
          lVar44 = local_80 + (long)(int)uVar33 * -2;
          lVar56 = 0;
          do {
            *(undefined4 *)((long)pvVar26 + lVar56 * 4 + (ulong)(uVar55 - uVar33) * 4) = 10000000;
            if (piVar11[iVar48 + lVar56] != 10000000) {
              uVar20 = (*evaluate)(1,iVar50,(iVar34 - uVar33) + (int)lVar56,iVar21,'\x12',&local_70)
              ;
              if (uVar20 != '\0') {
                uVar54 = vrna_get_ptype(iVar48 + (int)lVar56,pcVar13);
                lVar38 = (long)*(short *)((long)psVar12 + lVar56 * 2 + lVar44);
                if (lVar38 < 0) {
                  iVar35 = 0;
                }
                else {
                  iVar35 = pvVar7->dangle5[uVar54][lVar38];
                }
                if (2 < uVar54) {
                  iVar35 = iVar35 + pvVar7->TerminalAU;
                }
                *(int *)((long)pvVar26 + lVar56 * 4 + (ulong)(uVar55 - uVar33) * 4) =
                     iVar35 + piVar11[iVar48 + lVar56];
              }
            }
            lVar56 = lVar56 + -1;
            iVar21 = iVar21 + -1;
          } while (2 < iVar21);
          if ((code *)puVar19 != (code *)0x0) {
            iVar21 = iVar50 - uVar33;
            iVar48 = iVar34 - uVar33;
            piVar39 = (int *)((long)pvVar26 + (ulong)(uVar55 - uVar33) * 4);
            do {
              if (*piVar39 != 10000000) {
                iVar35 = (*(code *)puVar19)(uVar45,iVar48,iVar21,&local_e0);
                *piVar39 = *piVar39 + iVar35;
              }
              iVar21 = iVar21 + -1;
              iVar48 = iVar48 + -1;
              piVar39 = piVar39 + -1;
            } while (2 < iVar21);
          }
        }
        *(undefined4 *)((long)pvVar26 + 4) = 10000000;
        iVar21 = piVar30[uVar45];
        if ((piVar11[(long)iVar21 + 2] != 10000000) &&
           (uVar20 = (*evaluate)(1,iVar50,2,iVar50,'\x0e',&local_70), uVar20 != '\0')) {
          uVar33 = vrna_get_ptype(iVar21 + 2,pcVar13);
          lVar44 = (long)psVar12[1];
          if (lVar44 < 0) {
            iVar48 = 0;
          }
          else {
            iVar48 = pvVar7->dangle5[uVar33][lVar44];
          }
          if (2 < uVar33) {
            iVar48 = iVar48 + pvVar7->TerminalAU;
          }
          *(int *)((long)pvVar26 + 4) = iVar48 + piVar11[(long)iVar21 + 2];
          if ((code *)puVar18 != (code *)0x0) {
            iVar21 = (*(code *)puVar18)(uVar45,2,uVar45 & 0xffffffff,&local_e0);
            *(int *)((long)pvVar26 + 4) = *(int *)((long)pvVar26 + 4) + iVar21;
          }
        }
      }
      iVar35 = vrna_fun_zip_add_min
                         ((fc->matrices->field_2).field_0.f5 + 1,(int *)((long)pvVar26 + 8),
                          iVar51 - (fc->params->model_details).min_loop_size);
      iVar21 = *(int *)((long)pvVar26 + 4);
      free(pvVar26);
      pvVar26 = vrna_alloc(uVar47);
      puVar19 = local_e0.decomp_stem1;
      puVar18 = local_e0.red_stem;
      pvVar7 = fc->params;
      piVar30 = fc->jindx;
      piVar11 = (fc->matrices->field_2).field_0.c;
      uVar33 = (pvVar7->model_details).min_loop_size;
      iVar40 = iVar50 + -1;
      iVar48 = piVar30[uVar45 - 1];
      uVar54 = ~uVar33 + iVar50;
      uVar46 = (ulong)uVar54;
      if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
        uVar23 = fc->length;
        uVar43 = (fc->field_23).field_1.n_seq;
        uVar31 = (ulong)uVar43;
        pcVar13 = (fc->field_23).field_0.ptype_pf_compat;
        ppsVar14 = (fc->field_23).field_1.S3;
        ppuVar15 = (fc->field_23).field_1.a2s;
        uVar43 = uVar43 * 2;
        pvVar27 = vrna_alloc(uVar43);
        pvVar28 = vrna_alloc(uVar43);
        if (uVar31 != 0) {
          uVar29 = 0;
          do {
            puVar16 = ppuVar15[uVar29];
            sVar32 = -1;
            if (puVar16[uVar45 - 1] < puVar16[uVar23]) {
              sVar32 = ppsVar14[uVar29][uVar45 - 1];
            }
            *(short *)((long)pvVar27 + uVar29 * 2) = sVar32;
            *(undefined2 *)((long)pvVar28 + uVar29 * 2) =
                 *(undefined2 *)(*(long *)(pcVar13 + uVar29 * 8) + -2 + uVar45 * 2);
            uVar29 = uVar29 + 1;
          } while (uVar31 != uVar29);
        }
        if (1 < (int)uVar54) {
          lVar44 = (long)(int)(iVar48 + uVar54);
          uVar29 = uVar46;
          do {
            *(undefined4 *)((long)pvVar26 + uVar29 * 4) = 10000000;
            iVar48 = (int)uVar29;
            if (((piVar11[lVar44] != 10000000) &&
                (uVar20 = (*evaluate)(1,iVar50,iVar48 + -1,iVar48,'\x13',&local_70), uVar20 != '\0')
                ) && (*(int *)((long)pvVar26 + uVar29 * 4) = piVar11[lVar44], uVar31 != 0)) {
              uVar53 = 0;
              do {
                uVar54 = vrna_get_ptype_md((int)*(short *)(*(long *)(pcVar13 + uVar53 * 8) +
                                                          uVar29 * 2),
                                           (int)*(short *)((long)pvVar28 + uVar53 * 2),
                                           &pvVar7->model_details);
                lVar56 = (long)*(short *)((long)pvVar27 + uVar53 * 2);
                if (lVar56 < 0) {
                  iVar49 = 0;
                }
                else {
                  iVar49 = pvVar7->dangle3[uVar54][lVar56];
                }
                if (2 < uVar54) {
                  iVar49 = iVar49 + pvVar7->TerminalAU;
                }
                piVar39 = (int *)((long)pvVar26 + uVar29 * 4);
                *piVar39 = *piVar39 + iVar49;
                uVar53 = uVar53 + 1;
              } while (uVar31 != uVar53);
            }
            uVar29 = uVar29 - 1;
            lVar44 = lVar44 + -1;
          } while (2 < iVar48);
          if ((code *)puVar19 != (code *)0x0) {
            iVar49 = iVar50 - uVar33;
            iVar48 = iVar34 - uVar33;
            do {
              if (*(int *)((long)pvVar26 + uVar46 * 4) != 10000000) {
                iVar52 = (*(code *)puVar19)(uVar45,iVar48,uVar46 & 0xffffffff,&local_e0);
                piVar39 = (int *)((long)pvVar26 + uVar46 * 4);
                *piVar39 = *piVar39 + iVar52;
              }
              uVar46 = uVar46 - 1;
              iVar49 = iVar49 + -1;
              iVar48 = iVar48 + -1;
            } while (2 < iVar49);
          }
        }
        *(undefined4 *)((long)pvVar26 + 4) = 10000000;
        iVar48 = piVar30[uVar45 - 1];
        if ((piVar11[(long)iVar48 + 1] != 10000000) &&
           (uVar20 = (*evaluate)(1,iVar50,1,iVar40,'\x0e',&local_70), uVar20 != '\0')) {
          *(int *)((long)pvVar26 + 4) = piVar11[(long)iVar48 + 1];
          if (uVar31 != 0) {
            uVar46 = 0;
            do {
              uVar33 = vrna_get_ptype_md((int)*(short *)(*(long *)(pcVar13 + uVar46 * 8) + 2),
                                         (int)*(short *)((long)pvVar28 + uVar46 * 2),
                                         &pvVar7->model_details);
              lVar44 = (long)*(short *)((long)pvVar27 + uVar46 * 2);
              if (lVar44 < 0) {
                iVar48 = 0;
              }
              else {
                iVar48 = pvVar7->dangle3[uVar33][lVar44];
              }
              if (2 < uVar33) {
                iVar48 = iVar48 + pvVar7->TerminalAU;
              }
              *(int *)((long)pvVar26 + 4) = *(int *)((long)pvVar26 + 4) + iVar48;
              uVar46 = uVar46 + 1;
            } while (uVar31 != uVar46);
          }
          if ((code *)puVar18 != (code *)0x0) {
            iVar48 = (*(code *)puVar18)(uVar45,1,iVar40,&local_e0);
            *(int *)((long)pvVar26 + 4) = *(int *)((long)pvVar26 + 4) + iVar48;
          }
        }
        free(pvVar27);
        free(pvVar28);
      }
      else if (fc->type == VRNA_FC_TYPE_SINGLE) {
        pcVar13 = (fc->field_23).field_0.ptype;
        uVar2 = (fc->field_23).field_0.sequence_encoding[uVar45];
        if (1 < (int)uVar54) {
          iVar48 = (iVar48 + uVar55) - uVar33;
          iVar52 = iVar50 - uVar33;
          iVar49 = iVar34 - uVar33;
          lVar44 = 0;
          do {
            *(undefined4 *)((long)pvVar26 + lVar44 * 4 + (ulong)(uVar55 - uVar33) * 4) = 10000000;
            if (piVar11[iVar48 + lVar44] != 10000000) {
              iVar36 = (int)lVar44;
              uVar20 = (*evaluate)(1,iVar50,iVar49 + iVar36,iVar49 + iVar36 + 1,'\x13',&local_70);
              if (uVar20 != '\0') {
                uVar54 = vrna_get_ptype(iVar48 + iVar36,pcVar13);
                if ((short)uVar2 < 0) {
                  iVar36 = 0;
                }
                else {
                  iVar36 = pvVar7->dangle3[uVar54][uVar2];
                }
                if (2 < uVar54) {
                  iVar36 = iVar36 + pvVar7->TerminalAU;
                }
                *(int *)((long)pvVar26 + lVar44 * 4 + (ulong)(uVar55 - uVar33) * 4) =
                     iVar36 + piVar11[iVar48 + lVar44];
              }
            }
            lVar44 = lVar44 + -1;
            iVar52 = iVar52 + -1;
          } while (2 < iVar52);
          if ((code *)puVar19 != (code *)0x0) {
            iVar48 = iVar50 - uVar33;
            do {
              if (*(int *)((long)pvVar26 + uVar46 * 4) != 10000000) {
                iVar52 = (*(code *)puVar19)(uVar45,iVar49,uVar46 & 0xffffffff,&local_e0);
                piVar39 = (int *)((long)pvVar26 + uVar46 * 4);
                *piVar39 = *piVar39 + iVar52;
              }
              uVar46 = uVar46 - 1;
              iVar48 = iVar48 + -1;
              iVar49 = iVar49 + -1;
            } while (2 < iVar48);
          }
        }
        *(undefined4 *)((long)pvVar26 + 4) = 10000000;
        iVar48 = piVar30[uVar45 - 1];
        if ((piVar11[(long)iVar48 + 1] != 10000000) &&
           (uVar20 = (*evaluate)(1,iVar50,1,iVar40,'\x0e',&local_70), uVar20 != '\0')) {
          uVar33 = vrna_get_ptype(iVar48 + 1,pcVar13);
          if ((short)uVar2 < 0) {
            iVar49 = 0;
          }
          else {
            iVar49 = pvVar7->dangle3[uVar33][uVar2];
          }
          if (2 < uVar33) {
            iVar49 = iVar49 + pvVar7->TerminalAU;
          }
          *(int *)((long)pvVar26 + 4) = iVar49 + piVar11[(long)iVar48 + 1];
          if ((code *)puVar18 != (code *)0x0) {
            iVar48 = (*(code *)puVar18)(uVar45,1,iVar40,&local_e0);
            *(int *)((long)pvVar26 + 4) = *(int *)((long)pvVar26 + 4) + iVar48;
          }
        }
      }
      iVar52 = vrna_fun_zip_add_min
                         ((fc->matrices->field_2).field_0.f5 + 1,(int *)((long)pvVar26 + 8),
                          iVar51 - (fc->params->model_details).min_loop_size);
      iVar48 = *(int *)((long)pvVar26 + 4);
      free(pvVar26);
      pvVar26 = vrna_alloc(uVar47);
      puVar19 = local_e0.decomp_stem1;
      puVar18 = local_e0.red_stem;
      pvVar7 = fc->params;
      piVar30 = fc->jindx;
      piVar11 = (fc->matrices->field_2).field_0.c;
      uVar33 = (pvVar7->model_details).min_loop_size;
      iVar49 = piVar30[uVar45 - 1];
      if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
        uVar47 = fc->length;
        uVar54 = (fc->field_23).field_1.n_seq;
        uVar46 = (ulong)uVar54;
        pcVar13 = (fc->field_23).field_0.ptype_pf_compat;
        pvVar9 = (fc->field_23).field_0.sc;
        ppsVar14 = (fc->field_23).field_1.S3;
        ppuVar15 = (fc->field_23).field_1.a2s;
        uVar54 = uVar54 * 2;
        pvVar27 = vrna_alloc(uVar54);
        pvVar28 = vrna_alloc(uVar54);
        if (uVar46 != 0) {
          uVar31 = 0;
          do {
            sVar32 = -1;
            if (ppuVar15[uVar31][uVar45 - 1] < ppuVar15[uVar31][uVar47]) {
              sVar32 = ppsVar14[uVar31][uVar45 - 1];
            }
            *(short *)((long)pvVar27 + uVar31 * 2) = sVar32;
            *(undefined2 *)((long)pvVar28 + uVar31 * 2) =
                 *(undefined2 *)(*(long *)(pcVar13 + uVar31 * 8) + -2 + uVar45 * 2);
            uVar31 = uVar31 + 1;
          } while (uVar46 != uVar31);
        }
        if (1 < (int)(~uVar33 + iVar50)) {
          uVar31 = (ulong)(~uVar33 + iVar50);
          lVar44 = (long)(int)((iVar50 - uVar33) + iVar49);
          do {
            *(undefined4 *)((long)pvVar26 + uVar31 * 4) = 10000000;
            iVar49 = (int)uVar31;
            if (((piVar11[lVar44] != 10000000) &&
                (uVar20 = (*evaluate)(1,iVar50,iVar49 + -1,iVar49 + 1,'\x13',&local_70),
                uVar20 != '\0')) &&
               (*(int *)((long)pvVar26 + uVar31 * 4) = piVar11[lVar44], uVar46 != 0)) {
              uVar29 = 0;
              do {
                uVar47 = vrna_get_ptype_md((int)*(short *)(*(long *)(pcVar13 + uVar29 * 8) + 2 +
                                                          uVar31 * 2),
                                           (int)*(short *)((long)pvVar28 + uVar29 * 2),
                                           &pvVar7->model_details);
                if (ppuVar15[uVar29][uVar31 + 1] < 2) {
                  uVar2 = *(ushort *)((long)pvVar27 + uVar29 * 2);
                  uVar54 = (uint)(short)uVar2;
joined_r0x0011b82a:
                  paaiVar41 = (int (*) [5] [5])pvVar7->dangle3;
                  uVar23 = uVar47;
                  if (-1 < (short)uVar2) {
LAB_0011b839:
                    piVar39 = (*paaiVar41)[uVar23] + uVar54;
                    goto LAB_0011b841;
                  }
                  iVar36 = 0;
                }
                else {
                  uVar1 = *(ushort *)(*(long *)(&pvVar9->type + uVar29 * 2) + 2 + uVar31 * 2);
                  uVar2 = *(ushort *)((long)pvVar27 + uVar29 * 2);
                  uVar54 = (uint)(short)uVar2;
                  if (-1 < (short)(uVar2 | uVar1)) {
                    paaiVar41 = pvVar7->mismatchExt + uVar47;
                    uVar23 = (int)(short)uVar1;
                    goto LAB_0011b839;
                  }
                  if ((short)uVar1 < 0) goto joined_r0x0011b82a;
                  piVar39 = pvVar7->dangle5[uVar47] + (uint)(int)(short)uVar1;
LAB_0011b841:
                  iVar36 = *piVar39;
                }
                if (2 < uVar47) {
                  iVar36 = iVar36 + pvVar7->TerminalAU;
                }
                piVar39 = (int *)((long)pvVar26 + uVar31 * 4);
                *piVar39 = *piVar39 + iVar36;
                uVar29 = uVar29 + 1;
              } while (uVar46 != uVar29);
            }
            uVar31 = uVar31 - 1;
            lVar44 = lVar44 + -1;
          } while (2 < iVar49);
          if ((code *)puVar19 != (code *)0x0) {
            iVar49 = iVar50 - uVar33;
            iVar36 = iVar34 - uVar33;
            piVar39 = (int *)((long)pvVar26 + (ulong)(uVar55 - uVar33) * 4);
            do {
              if (*piVar39 != 10000000) {
                iVar37 = (*(code *)puVar19)(uVar45,iVar36,iVar49,&local_e0);
                *piVar39 = *piVar39 + iVar37;
              }
              iVar49 = iVar49 + -1;
              iVar36 = iVar36 + -1;
              piVar39 = piVar39 + -1;
            } while (2 < iVar49);
          }
        }
        *(undefined4 *)((long)pvVar26 + 4) = 10000000;
        iVar49 = piVar30[uVar45 - 1];
        if ((piVar11[(long)iVar49 + 2] != 10000000) &&
           (uVar20 = (*evaluate)(1,iVar50,2,iVar40,'\x0e',&local_70), uVar20 != '\0')) {
          *(int *)((long)pvVar26 + 4) = piVar11[(long)iVar49 + 2];
          if (uVar46 != 0) {
            uVar31 = 0;
            do {
              uVar33 = vrna_get_ptype_md((int)*(short *)(*(long *)(pcVar13 + uVar31 * 8) + 4),
                                         (int)*(short *)((long)pvVar28 + uVar31 * 2),
                                         &pvVar7->model_details);
              if (ppuVar15[uVar31][2] < 2) {
                uVar2 = *(ushort *)((long)pvVar27 + uVar31 * 2);
                uVar47 = (uint)(short)uVar2;
joined_r0x0011ba02:
                if (-1 < (short)uVar2) {
                  paiVar42 = pvVar7->dangle3 + uVar33;
LAB_0011ba10:
                  piVar30 = *paiVar42 + uVar47;
                  goto LAB_0011ba14;
                }
                iVar49 = 0;
              }
              else {
                uVar1 = *(ushort *)(*(long *)(&pvVar9->type + uVar31 * 2) + 4);
                uVar2 = *(ushort *)((long)pvVar27 + uVar31 * 2);
                uVar47 = (uint)(short)uVar2;
                if (-1 < (short)(uVar2 | uVar1)) {
                  paiVar42 = pvVar7->mismatchExt[uVar33] + (uint)(int)(short)uVar1;
                  goto LAB_0011ba10;
                }
                if ((short)uVar1 < 0) goto joined_r0x0011ba02;
                piVar30 = pvVar7->dangle5[uVar33] + (uint)(int)(short)uVar1;
LAB_0011ba14:
                iVar49 = *piVar30;
              }
              if (2 < uVar33) {
                iVar49 = iVar49 + pvVar7->TerminalAU;
              }
              *(int *)((long)pvVar26 + 4) = *(int *)((long)pvVar26 + 4) + iVar49;
              uVar31 = uVar31 + 1;
            } while (uVar46 != uVar31);
          }
          if ((code *)puVar18 != (code *)0x0) {
            iVar40 = (*(code *)puVar18)(uVar45,2,iVar40,&local_e0);
            *(int *)((long)pvVar26 + 4) = *(int *)((long)pvVar26 + 4) + iVar40;
          }
        }
        free(pvVar27);
        free(pvVar28);
      }
      else if (fc->type == VRNA_FC_TYPE_SINGLE) {
        psVar12 = (fc->field_23).field_0.sequence_encoding;
        pcVar13 = (fc->field_23).field_0.ptype;
        uVar2 = psVar12[uVar45];
        uVar47 = (uint)(short)uVar2;
        if (1 < (int)(~uVar33 + iVar50)) {
          local_38 = (int (*) [5] [5])pvVar7->dangle3;
          iVar49 = (iVar49 + iVar50) - uVar33;
          iVar36 = iVar50 - uVar33;
          lVar44 = local_80 + (long)(int)uVar33 * -2;
          lVar56 = 0;
          do {
            *(undefined4 *)((long)pvVar26 + lVar56 * 4 + (ulong)(uVar55 - uVar33) * 4) = 10000000;
            if (piVar11[iVar49 + lVar56] != 10000000) {
              uVar20 = (*evaluate)(1,iVar50,(int)lVar56 + (iVar34 - uVar33),iVar36,'\x13',&local_70)
              ;
              if (uVar20 != '\0') {
                uVar54 = vrna_get_ptype(iVar49 + (int)lVar56,pcVar13);
                uVar1 = *(ushort *)((long)psVar12 + lVar56 * 2 + lVar44);
                if ((short)(uVar1 | uVar2) < 0) {
                  if (-1 < (short)uVar1) {
                    piVar39 = pvVar7->dangle5[uVar54] + (uint)(int)(short)uVar1;
                    goto LAB_0011b5f9;
                  }
                  paaiVar41 = local_38;
                  uVar23 = uVar54;
                  if (-1 < (short)uVar2) goto LAB_0011b5d0;
                  iVar37 = 0;
                }
                else {
                  paaiVar41 = pvVar7->mismatchExt + uVar54;
                  uVar23 = (int)(short)uVar1;
LAB_0011b5d0:
                  piVar39 = (*paaiVar41)[uVar23] + uVar47;
LAB_0011b5f9:
                  iVar37 = *piVar39;
                }
                if (2 < uVar54) {
                  iVar37 = iVar37 + pvVar7->TerminalAU;
                }
                *(int *)((long)pvVar26 + lVar56 * 4 + (ulong)(uVar55 - uVar33) * 4) =
                     iVar37 + piVar11[iVar49 + lVar56];
              }
            }
            lVar56 = lVar56 + -1;
            iVar36 = iVar36 + -1;
          } while (2 < iVar36);
          if ((code *)puVar19 != (code *)0x0) {
            iVar49 = iVar50 - uVar33;
            iVar36 = iVar34 - uVar33;
            piVar39 = (int *)((long)pvVar26 + (ulong)(uVar55 - uVar33) * 4);
            do {
              if (*piVar39 != 10000000) {
                iVar37 = (*(code *)puVar19)(uVar45,iVar36,iVar49,&local_e0);
                *piVar39 = *piVar39 + iVar37;
              }
              iVar49 = iVar49 + -1;
              iVar36 = iVar36 + -1;
              piVar39 = piVar39 + -1;
            } while (2 < iVar49);
          }
        }
        *(undefined4 *)((long)pvVar26 + 4) = 10000000;
        iVar49 = piVar30[uVar45 - 1];
        if ((piVar11[(long)iVar49 + 2] != 10000000) &&
           (uVar20 = (*evaluate)(1,iVar50,2,iVar40,'\x0e',&local_70), uVar20 != '\0')) {
          uVar33 = vrna_get_ptype(iVar49 + 2,pcVar13);
          uVar1 = psVar12[1];
          if ((short)(uVar1 | uVar2) < 0) {
            if (-1 < (short)uVar1) {
              piVar30 = pvVar7->dangle5[uVar33] + (uint)(int)(short)uVar1;
              goto LAB_0011bcca;
            }
            if (-1 < (short)uVar2) {
              piVar30 = pvVar7->dangle3[uVar33] + uVar47;
              goto LAB_0011bcca;
            }
            iVar36 = 0;
          }
          else {
            piVar30 = pvVar7->mismatchExt[uVar33][(uint)(int)(short)uVar1] + uVar47;
LAB_0011bcca:
            iVar36 = *piVar30;
          }
          if (2 < uVar33) {
            iVar36 = iVar36 + pvVar7->TerminalAU;
          }
          *(int *)((long)pvVar26 + 4) = iVar36 + piVar11[(long)iVar49 + 2];
          if ((code *)puVar18 != (code *)0x0) {
            iVar40 = (*(code *)puVar18)(uVar45,2,iVar40,&local_e0);
            *(int *)((long)pvVar26 + 4) = *(int *)((long)pvVar26 + 4) + iVar40;
          }
        }
      }
      if (iVar52 < iVar48) {
        iVar48 = iVar52;
      }
      if (iVar35 < iVar21) {
        iVar21 = iVar35;
      }
      if (iVar24 < iVar22) {
        iVar22 = iVar24;
      }
      iVar51 = vrna_fun_zip_add_min
                         ((fc->matrices->field_2).field_0.f5 + 1,(int *)((long)pvVar26 + 8),
                          iVar51 - (fc->params->model_details).min_loop_size);
      iVar24 = *(int *)((long)pvVar26 + 4);
      if (iVar51 < *(int *)((long)pvVar26 + 4)) {
        iVar24 = iVar51;
      }
      if (iVar21 <= iVar22) {
        iVar22 = iVar21;
      }
      if (iVar48 <= iVar22) {
        iVar22 = iVar48;
      }
      free(pvVar26);
      if (iVar24 <= iVar22) {
        iVar22 = iVar24;
      }
      if (piVar6[uVar45] <= iVar22) {
        iVar22 = piVar6[uVar45];
      }
      if (9999999 < iVar22) {
        iVar22 = 10000000;
      }
      piVar6[uVar45] = iVar22;
      if (iVar4 != 0) {
        piVar30 = (fc->matrices->field_2).field_0.ggg;
        uVar33 = (fc->params->model_details).min_loop_size;
        iVar21 = 10000000;
        if (1 < (int)(~uVar33 + iVar50)) {
          iVar24 = iVar50 - uVar33;
          iVar21 = 10000000;
          lVar44 = 0;
          do {
            iVar51 = *(int *)((long)(fc->matrices->field_2).field_0.f5 +
                             lVar44 + (ulong)(uVar55 - uVar33) * 4 + -4);
            if (((iVar51 != 10000000) &&
                (iVar48 = *(int *)((long)piVar30 +
                                  lVar44 + (long)(int)((fc->jindx[uVar45] + uVar55) - uVar33) * 4),
                iVar48 != 10000000)) && (iVar48 = iVar48 + iVar51, iVar48 <= iVar21)) {
              iVar21 = iVar48;
            }
            lVar44 = lVar44 + -4;
            iVar24 = iVar24 + -1;
          } while (2 < iVar24);
        }
        iVar24 = piVar30[(long)fc->jindx[uVar45] + 1];
        if (iVar21 < iVar24) {
          iVar24 = iVar21;
        }
        if (iVar22 < iVar24) {
          iVar24 = iVar22;
        }
        piVar6[uVar45] = iVar24;
      }
      if ((pvVar8 != (vrna_gr_aux_t *)0x0) && (pvVar8->cb_aux_f != (vrna_callback_gr_rule *)0x0)) {
        iVar22 = (*pvVar8->cb_aux_f)(fc,1,iVar50,pvVar8->data);
        if (piVar6[uVar45] < iVar22) {
          iVar22 = piVar6[uVar45];
        }
        piVar6[uVar45] = iVar22;
      }
      uVar45 = uVar45 + 1;
      local_1a0 = (ulong)(iVar34 + 1);
      local_80 = local_80 + 2;
    } while (local_74 != (int)uVar45);
  }
  free(local_e0.up_comparative);
  free(local_e0.user_cb_comparative);
  free(local_e0.user_data_comparative);
  return piVar6[(int)uVar3];
}

Assistant:

PUBLIC int
vrna_E_ext_loop_5(vrna_fold_compound_t *fc)
{
  if (fc) {
    int                       en, j, length, *f5, dangle_model, with_gquad, turn;
    vrna_param_t              *P;
    vrna_callback_hc_evaluate *evaluate;
    struct default_data       hc_dat_local;
    struct sc_wrapper_f5      sc_wrapper;
    vrna_gr_aux_t             *grammar;

    length        = (int)fc->length;
    f5            = fc->matrices->f5;
    P             = fc->params;
    dangle_model  = P->model_details.dangles;
    with_gquad    = P->model_details.gquad;
    turn          = P->model_details.min_loop_size;
    grammar       = fc->aux_grammar;
    evaluate      = prepare_hc_default(fc, &hc_dat_local);

    init_sc_wrapper(fc, &sc_wrapper);

    f5[0] = 0;
    for (j = 1; j <= turn + 1; j++)
      f5[j] = reduce_f5_up(fc, j, evaluate, &hc_dat_local, &sc_wrapper);

    if ((grammar) && (grammar->cb_aux_f)) {
      for (j = 1; j <= turn + 1; j++) {
        en    = grammar->cb_aux_f(fc, 1, j, grammar->data);
        f5[j] = MIN2(f5[j], en);
      }
    }

    /*
     *  duplicated code may be faster than conditions inside loop or even
     *  using a function pointer ;)
     */
    switch (dangle_model) {
      case 2:
        for (j = turn + 2; j <= length; j++) {
          /* extend previous solution(s) by adding an unpaired region */
          f5[j] = reduce_f5_up(fc, j, evaluate, &hc_dat_local, &sc_wrapper);

          /* decompose into exterior loop part followed by a stem */
          en    = decompose_f5_ext_stem_d2(fc, j, evaluate, &hc_dat_local, &sc_wrapper);
          f5[j] = MIN2(f5[j], en);

          if (with_gquad) {
            en    = add_f5_gquad(fc, j, evaluate, &hc_dat_local, &sc_wrapper);
            f5[j] = MIN2(f5[j], en);
          }

          if ((grammar) && (grammar->cb_aux_f)) {
            en    = grammar->cb_aux_f(fc, 1, j, grammar->data);
            f5[j] = MIN2(f5[j], en);
          }
        }
        break;

      case 0:
        for (j = turn + 2; j <= length; j++) {
          /* extend previous solution(s) by adding an unpaired region */
          f5[j] = reduce_f5_up(fc, j, evaluate, &hc_dat_local, &sc_wrapper);

          /* decompose into exterior loop part followed by a stem */
          en    = decompose_f5_ext_stem_d0(fc, j, evaluate, &hc_dat_local, &sc_wrapper);
          f5[j] = MIN2(f5[j], en);

          if (with_gquad) {
            en    = add_f5_gquad(fc, j, evaluate, &hc_dat_local, &sc_wrapper);
            f5[j] = MIN2(f5[j], en);
          }

          if ((grammar) && (grammar->cb_aux_f)) {
            en    = grammar->cb_aux_f(fc, 1, j, grammar->data);
            f5[j] = MIN2(f5[j], en);
          }
        }
        break;

      default:
        for (j = turn + 2; j <= length; j++) {
          /* extend previous solution(s) by adding an unpaired region */
          f5[j] = reduce_f5_up(fc, j, evaluate, &hc_dat_local, &sc_wrapper);

          en    = decompose_f5_ext_stem_d1(fc, j, evaluate, &hc_dat_local, &sc_wrapper);
          f5[j] = MIN2(f5[j], en);

          if (with_gquad) {
            en    = add_f5_gquad(fc, j, evaluate, &hc_dat_local, &sc_wrapper);
            f5[j] = MIN2(f5[j], en);
          }

          if ((grammar) && (grammar->cb_aux_f)) {
            en    = grammar->cb_aux_f(fc, 1, j, grammar->data);
            f5[j] = MIN2(f5[j], en);
          }
        }
        break;
    }

    free_sc_wrapper(&sc_wrapper);

    return f5[length];
  }

  return INF;
}